

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O2

void Popup_Error(Am_Value_List *strings)

{
  char cVar1;
  Am_Object *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object AStack_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Value local_20;
  
  cVar1 = Am_Object::Valid();
  if (cVar1 == '\0') {
    Am_Object::Create((char *)&local_28);
    pAVar2 = (Am_Object *)Am_Object::Set((ushort)&local_28,true,0);
    Am_Object::operator=(&error_dialog,pAVar2);
    Am_Object::~Am_Object(&local_28);
    Am_Object::Am_Object(&local_30,&error_dialog);
    Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_30,0),1);
    Am_Object::~Am_Object(&local_30);
  }
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(strings);
  Am_Object::Set(0x5e8,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  Am_Object::Am_Object(&local_40,&error_dialog);
  Am_Object::Am_Object(&AStack_48,&window);
  Show_Dialog_Centered(&local_40,&AStack_48);
  Am_Object::~Am_Object(&AStack_48);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Am_Object(&local_38,&error_dialog);
  Am_Show_Dialog_And_Wait((Am_Object_Data *)&local_20,SUB81(&local_38,0));
  Am_Value::~Am_Value(&local_20);
  Am_Object::~Am_Object(&local_38);
  return;
}

Assistant:

void
Popup_Error(Am_Value_List strings)
{
  if (!error_dialog.Valid()) {
    error_dialog =
        Am_Alert_Dialog.Create("error_dialog").Set(Am_VISIBLE, false);
    Am_Screen.Add_Part(error_dialog);
  }

  // add new message to error dialog
  error_dialog.Set(Am_ITEMS, strings);

  // show it
  Show_Dialog_Centered(error_dialog, window);
  Am_Show_Dialog_And_Wait(error_dialog);
}